

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode DiagnosticInfo_copy(UA_DiagnosticInfo *src,UA_DiagnosticInfo *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  UA_DiagnosticInfo *pUVar2;
  uint local_24;
  UA_StatusCode retval;
  UA_DataType *__local;
  UA_DiagnosticInfo *dst_local;
  UA_DiagnosticInfo *src_local;
  
  memcpy(dst,src,0x38);
  UA_String_init(&dst->additionalInfo);
  dst->innerDiagnosticInfo = (UA_DiagnosticInfo *)0x0;
  local_24 = 0;
  if ((*(byte *)src >> 4 & 1) != 0) {
    local_24 = UA_String_copy(&src->additionalInfo,&dst->additionalInfo);
  }
  if (((*(byte *)src >> 6 & 1) != 0) && (src->innerDiagnosticInfo != (UA_DiagnosticInfo *)0x0)) {
    pUVar2 = (UA_DiagnosticInfo *)malloc(0x38);
    dst->innerDiagnosticInfo = pUVar2;
    if (dst->innerDiagnosticInfo == (UA_DiagnosticInfo *)0x0) {
      *(byte *)dst = *(byte *)dst & 0xbf;
      local_24 = local_24 | 0x80030000;
    }
    else {
      UVar1 = DiagnosticInfo_copy(src->innerDiagnosticInfo,dst->innerDiagnosticInfo,
                                  (UA_DataType *)0x0);
      local_24 = UVar1 | local_24;
      *(byte *)dst = *(byte *)dst & 0xbf | 0x40;
    }
  }
  return local_24;
}

Assistant:

static UA_StatusCode
DiagnosticInfo_copy(UA_DiagnosticInfo const *src, UA_DiagnosticInfo *dst,
                    const UA_DataType *_) {
    memcpy(dst, src, sizeof(UA_DiagnosticInfo));
    UA_String_init(&dst->additionalInfo);
    dst->innerDiagnosticInfo = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(src->hasAdditionalInfo)
       retval = UA_String_copy(&src->additionalInfo, &dst->additionalInfo);
    if(src->hasInnerDiagnosticInfo && src->innerDiagnosticInfo) {
        dst->innerDiagnosticInfo = (UA_DiagnosticInfo*)UA_malloc(sizeof(UA_DiagnosticInfo));
        if(dst->innerDiagnosticInfo) {
            retval |= DiagnosticInfo_copy(src->innerDiagnosticInfo,
                                          dst->innerDiagnosticInfo, NULL);
            dst->hasInnerDiagnosticInfo = true;
        } else {
            dst->hasInnerDiagnosticInfo = false;
            retval |= UA_STATUSCODE_BADOUTOFMEMORY;
        }
    }
    return retval;
}